

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DestroyPlatformWindow(ImGuiViewportP *viewport)

{
  _func_void_ImGuiViewport_ptr *p_Var1;
  ImGuiContext *pIVar2;
  
  pIVar2 = GImGui;
  if (viewport->PlatformWindowCreated == true) {
    p_Var1 = (GImGui->PlatformIO).Renderer_DestroyWindow;
    if (p_Var1 != (_func_void_ImGuiViewport_ptr *)0x0) {
      (*p_Var1)(&viewport->super_ImGuiViewport);
    }
    p_Var1 = (pIVar2->PlatformIO).Platform_DestroyWindow;
    if (p_Var1 != (_func_void_ImGuiViewport_ptr *)0x0) {
      (*p_Var1)(&viewport->super_ImGuiViewport);
    }
    if (((viewport->super_ImGuiViewport).RendererUserData != (void *)0x0) ||
       ((viewport->super_ImGuiViewport).PlatformUserData != (void *)0x0)) {
      __assert_fail("viewport->RendererUserData == __null && viewport->PlatformUserData == __null",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0x3125,"void ImGui::DestroyPlatformWindow(ImGuiViewportP *)");
    }
    if ((viewport->super_ImGuiViewport).ID != 0x11111111) {
      viewport->PlatformWindowCreated = false;
    }
  }
  else if ((((viewport->super_ImGuiViewport).RendererUserData != (void *)0x0) ||
           ((viewport->super_ImGuiViewport).PlatformUserData != (void *)0x0)) ||
          ((viewport->super_ImGuiViewport).PlatformHandle != (void *)0x0)) {
    __assert_fail("viewport->RendererUserData == __null && viewport->PlatformUserData == __null && viewport->PlatformHandle == __null"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x312e,"void ImGui::DestroyPlatformWindow(ImGuiViewportP *)");
  }
  (viewport->super_ImGuiViewport).PlatformRequestMove = false;
  (viewport->super_ImGuiViewport).PlatformRequestResize = false;
  (viewport->super_ImGuiViewport).PlatformRequestClose = false;
  (viewport->super_ImGuiViewport).RendererUserData = (void *)0x0;
  (viewport->super_ImGuiViewport).PlatformUserData = (void *)0x0;
  (viewport->super_ImGuiViewport).PlatformHandle = (void *)0x0;
  return;
}

Assistant:

void ImGui::DestroyPlatformWindow(ImGuiViewportP* viewport)
{
    ImGuiContext& g = *GImGui;
    if (viewport->PlatformWindowCreated)
    {
        if (g.PlatformIO.Renderer_DestroyWindow)
            g.PlatformIO.Renderer_DestroyWindow(viewport);
        if (g.PlatformIO.Platform_DestroyWindow)
            g.PlatformIO.Platform_DestroyWindow(viewport);
        IM_ASSERT(viewport->RendererUserData == NULL && viewport->PlatformUserData == NULL);

        // Don't clear PlatformWindowCreated for the main viewport, as we initially set that up to true in Initialize()
        // The righter way may be to leave it to the backend to set this flag all-together, and made the flag public.
        if (viewport->ID != IMGUI_VIEWPORT_DEFAULT_ID)
            viewport->PlatformWindowCreated = false;
    }
    else
    {
        IM_ASSERT(viewport->RendererUserData == NULL && viewport->PlatformUserData == NULL && viewport->PlatformHandle == NULL);
    }
    viewport->RendererUserData = viewport->PlatformUserData = viewport->PlatformHandle = NULL;
    viewport->ClearRequestFlags();
}